

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prepared-c.cpp
# Opt level: O2

duckdb_state
duckdb_bind_varchar_length
          (duckdb_prepared_statement prepared_statement,idx_t param_idx,char *val,idx_t length)

{
  duckdb_state dVar1;
  string local_70;
  Value value;
  
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,val,val + length);
  duckdb::Value::Value(&value,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  dVar1 = duckdb_bind_value(prepared_statement,param_idx,(duckdb_value)&value);
  duckdb::Value::~Value(&value);
  return dVar1;
}

Assistant:

duckdb_state duckdb_bind_varchar_length(duckdb_prepared_statement prepared_statement, idx_t param_idx, const char *val,
                                        idx_t length) {
	try {
		auto value = Value(std::string(val, length));
		return duckdb_bind_value(prepared_statement, param_idx, (duckdb_value)&value);
	} catch (...) {
		return DuckDBError;
	}
}